

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  Transform *pTVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Point3f pHit;
  Tuple3<pbrt::Normal3,_float> local_1b8;
  Tuple3<pbrt::Normal3,_float> local_1a8;
  Tuple3<pbrt::Vector3,_float> local_198;
  undefined1 local_188 [16];
  Tuple2<pbrt::Point2,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_168;
  Tuple3<pbrt::Vector3,_float> local_158;
  Vector3f local_14c;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  pHit.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  FVar1 = this->phiMax;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(pHit.super_Tuple3<pbrt::Point3,_float>.y *
                                          pHit.super_Tuple3<pbrt::Point3,_float>.y)),
                            ZEXT416((uint)pHit.super_Tuple3<pbrt::Point3,_float>.x),
                            ZEXT416((uint)pHit.super_Tuple3<pbrt::Point3,_float>.x));
  if (auVar11._0_4_ < 0.0) {
    local_188 = ZEXT416((uint)isect->phi);
    local_198.z = sqrtf(auVar11._0_4_);
    auVar11 = local_188;
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    local_198.z = auVar11._0_4_;
    auVar11 = ZEXT416((uint)isect->phi);
  }
  fVar2 = this->radius;
  auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)(fVar2 - local_198.z)),0x10);
  auVar8 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)(fVar2 - this->innerRadius)),0x10);
  auVar11 = vdivps_avx(auVar11,auVar8);
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)this->phiMax),auVar8);
  local_14c.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar2 = this->innerRadius - fVar2;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ = pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar8 = vmovshdup_avx(auVar12);
  local_14c.super_Tuple3<pbrt::Vector3,_float>.x = auVar8._0_4_ * auVar9._0_4_;
  local_14c.super_Tuple3<pbrt::Vector3,_float>.y =
       this->phiMax * pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9._0_4_ = fVar2 * pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9._4_4_ = fVar2 * pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar9._8_4_ = fVar2 * 0.0;
  auVar9._12_4_ = fVar2 * 0.0;
  auVar10._4_4_ = local_198.z;
  auVar10._0_4_ = local_198.z;
  auVar10._8_4_ = local_198.z;
  auVar10._12_4_ = local_198.z;
  auVar8 = vdivps_avx(auVar9,auVar10);
  local_198.z = (fVar2 * 0.0) / local_198.z;
  local_198._0_8_ = vmovlps_avx(auVar8);
  local_1a8.x = 0.0;
  local_1a8.y = 0.0;
  local_1a8.z = 0.0;
  local_1b8.x = 0.0;
  local_1b8.y = 0.0;
  local_1b8.z = 0.0;
  pHit.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  local_158.x = 0.0;
  local_158.y = 0.0;
  local_158.z = 0.0;
  bVar5 = this->reverseOrientation;
  bVar6 = this->transformSwapsHandedness;
  pTVar7 = this->objectFromRender;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar3 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar4 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[0][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[0][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[0][2]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[1][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[1][0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[1][2]));
  auVar8 = vinsertps_avx(auVar8,auVar9,0x10);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pTVar7->m).m[2][1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(pTVar7->m).m[2][0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)(pTVar7->m).m[2][2]));
  local_168._0_8_ = vmovlps_avx(auVar8);
  local_168.z = auVar9._0_4_;
  pTVar7 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_158);
  local_170 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_170,(Vector3f *)&local_168,&local_14c,
             (Vector3f *)&local_198,(Normal3f *)&local_1a8,(Normal3f *)&local_1b8,time,
             bVar5 != bVar6);
  Transform::operator()(__return_storage_ptr__,pTVar7,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }